

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O1

ptr<resp_msg> __thiscall nuraft::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  _func_int *p_Var5;
  pointer psVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  native_handle_type nVar9;
  _func_int **pp_Var10;
  int iVar11;
  long lVar12;
  element_type *peVar13;
  long in_RDX;
  ulong uVar14;
  undefined **ppuVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  char *pcVar16;
  _func_int *p_Var17;
  _func_int *p_Var18;
  undefined1 auVar19 [16];
  ptr<resp_msg> pVar20;
  string local_a8;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined1 local_6f;
  long local_68;
  pointer local_60;
  raft_server *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar11 = *(int *)(in_RDX + 0x14);
  uVar4 = req[6].super_msg_base.term_;
  uVar14 = (ulong)(long)iVar11 % uVar4;
  p_Var17 = req[6].super_msg_base._vptr_msg_base[uVar14];
  p_Var18 = (_func_int *)0x0;
  if ((p_Var17 != (_func_int *)0x0) &&
     (p_Var5 = *(_func_int **)p_Var17, p_Var18 = p_Var17,
     iVar11 != *(int *)(*(_func_int **)p_Var17 + 8))) {
    while (p_Var17 = p_Var5, p_Var5 = *(_func_int **)p_Var17, p_Var5 != (_func_int *)0x0) {
      p_Var18 = (_func_int *)0x0;
      if (((ulong)(long)*(int *)(p_Var5 + 8) % uVar4 != uVar14) ||
         (p_Var18 = p_Var17, iVar11 == *(int *)(p_Var5 + 8))) goto LAB_001ac94a;
    }
    p_Var18 = (_func_int *)0x0;
  }
LAB_001ac94a:
  if (p_Var18 == (_func_int *)0x0) {
    lVar12 = -1;
  }
  else {
    lVar12 = -(ulong)(*(long *)p_Var18 == 0);
  }
  psVar6 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((psVar6 != (pointer)0x0) &&
     (iVar11 = (*(code *)(psVar6->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     3 < iVar11)) {
    psVar6 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar11 = *(int *)&req[8].log_entries_.
                      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar11 == 3) {
      local_80 = 6;
      local_78 = CONCAT17(local_78._7_1_,0x72656461656c);
    }
    else if (iVar11 == 2) {
      local_78 = 0x74616469646e6163;
      local_70 = 0x65;
      local_80 = 9;
      local_6f = 0;
    }
    else if (iVar11 == 1) {
      local_78 = 0x7265776f6c6c6f66;
      local_80 = 8;
      local_70 = 0;
    }
    else {
      local_78 = 0x4e574f4e4b4e55;
      local_80 = 7;
    }
    uVar1 = *(uint *)(in_RDX + 0x14);
    uVar7 = *(undefined8 *)(in_RDX + 0x20);
    local_88 = &local_78;
    local_68 = lVar12;
    local_58 = this;
    (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&local_40);
    uVar8 = *local_40;
    local_50 = *(undefined8 *)(in_RDX + 0x28);
    local_60 = psVar6;
    local_48 = uVar7;
    lVar12 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    pcVar16 = "HB dead";
    if ((req[2].last_log_term_ & 1) != 0) {
      pcVar16 = "HB alive";
    }
    msg_if_given_abi_cxx11_
              (&local_a8,
               "[PRE-VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\n%s"
               ,&local_78,(ulong)uVar1,local_48,uVar8,local_50,lVar12 + -1,
               *(undefined8 *)(in_RDX + 8),req[9].super_msg_base._vptr_msg_base[1],pcVar16);
    (*(code *)(local_60->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)(local_60,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_req",0x19d,&local_a8);
    this = local_58;
    lVar12 = local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
  }
  nVar9 = *(native_handle_type *)(in_RDX + 8);
  uVar2 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar13 = (element_type *)operator_new(0xb0);
  (peVar13->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar13->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4200;
  uVar3 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar13->bg_commit_thread_)._M_id._M_thread = nVar9;
  *(undefined4 *)&(peVar13->bg_append_thread_)._M_id._M_thread = 0x15;
  *(undefined4 *)((long)&(peVar13->bg_append_thread_)._M_id._M_thread + 4) = uVar3;
  *(undefined4 *)&peVar13->bg_append_ea_ = uVar2;
  ppuVar15 = &PTR__resp_msg_005c4250;
  (peVar13->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005c4250;
  peVar13->initialized_ = (atomic<bool>)(char)lVar12;
  *(int3 *)&peVar13->field_0x31 = (int3)((ulong)lVar12 >> 8);
  peVar13->leader_ = (atomic<int>)(int)((ulong)lVar12 >> 0x20);
  peVar13->id_ = 0;
  peVar13->my_priority_ = 0;
  *(undefined1 *)&peVar13->target_priority_ = 0;
  (peVar13->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar13->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar13->votes_responded_ = 0;
  peVar13->votes_granted_ = 0;
  (peVar13->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar13->priority_change_timer_).first_event_fired_ = 0;
  (peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar13->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar13->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar13->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar13->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (((((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) &&
      (psVar6 = req[9].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar6 != (pointer)0x0)) &&
     (iVar11 = (*(code *)(psVar6->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     ppuVar15 = (undefined **)extraout_RDX, 3 < iVar11)) {
    psVar6 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"this server is catching up, always accept pre-vote");
    (*(code *)(psVar6->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar6,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1ad,&local_a8);
    ppuVar15 = (undefined **)extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
      ppuVar15 = (undefined **)extraout_RDX_01;
    }
  }
  if (((req[2].last_log_term_ & 1) == 0) ||
     (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0)) {
    psVar6 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar6 != (pointer)0x0) &&
       (iVar11 = (*(code *)(psVar6->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), 3 < iVar11)) {
      psVar6 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: O (grant)");
      (*(code *)(psVar6->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar6,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_prevote_req",0x1b0,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    pp_Var10 = this->_vptr_raft_server;
    auVar19 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    ppuVar15 = auVar19._8_8_;
    pp_Var10[4] = auVar19._0_8_;
    *(undefined1 *)(pp_Var10 + 6) = 1;
    goto LAB_001acce1;
  }
  psVar6 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (lVar12 == -1) {
    if ((psVar6 == (pointer)0x0) ||
       (iVar11 = (*(code *)(psVar6->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), ppuVar15 = (undefined **)extraout_RDX_04, iVar11 < 4))
    goto LAB_001acce1;
    psVar6 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: XX (strong deny, non-existing node)");
    (*(code *)(psVar6->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar6,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1b6,&local_a8);
    ppuVar15 = (undefined **)extraout_RDX_05;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_001acce1;
  }
  else {
    if ((psVar6 == (pointer)0x0) ||
       (iVar11 = (*(code *)(psVar6->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), ppuVar15 = (undefined **)extraout_RDX_02, iVar11 < 4))
    goto LAB_001acce1;
    psVar6 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: X (deny)");
    (*(code *)(psVar6->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar6,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1b4,&local_a8);
    ppuVar15 = (undefined **)extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_001acce1;
  }
  operator_delete(local_a8._M_dataplus._M_p);
  ppuVar15 = (undefined **)extraout_RDX_06;
LAB_001acce1:
  pVar20.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar15;
  pVar20.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar20.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req) {
    ulong next_idx_for_resp = 0;
    auto entry = peers_.find(req.get_src());
    if (entry == peers_.end()) {
        // This node already has been removed, set a special value.
        next_idx_for_resp = std::numeric_limits<ulong>::max();
    }

    p_in("[PRE-VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "%s",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(),
         log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         (hb_alive_) ? "HB alive" : "HB dead");

    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::pre_vote_response,
            id_,
            req.get_src(),
            next_idx_for_resp ) );

    // NOTE:
    //   While `catching_up_` flag is on, this server does not get
    //   normal append_entries request so that `hb_alive_` may not
    //   be cleared properly. Hence, it should accept any pre-vote
    //   requests.
    if (catching_up_) {
        p_in("this server is catching up, always accept pre-vote");
    }
    if (!hb_alive_ || catching_up_) {
        p_in("pre-vote decision: O (grant)");
        resp->accept(log_store_->next_slot());
    } else {
        if (next_idx_for_resp != std::numeric_limits<ulong>::max()) {
            p_in("pre-vote decision: X (deny)");
        } else {
            p_in("pre-vote decision: XX (strong deny, non-existing node)");
        }
    }

    return resp;
}